

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int free_streams(void *entry,void *ptr)

{
  nghttp2_mem *mem;
  nghttp2_outbound_item *item;
  
  mem = (nghttp2_mem *)((long)ptr + 0x9e0);
  item = *(nghttp2_outbound_item **)((long)entry + 0x98);
  if (((item != (nghttp2_outbound_item *)0x0) && (item->queued == '\0')) &&
     (item != *(nghttp2_outbound_item **)((long)ptr + 0x288))) {
    nghttp2_outbound_item_free(item,mem);
    nghttp2_mem_free(mem,item);
  }
  nghttp2_stream_free((nghttp2_stream *)entry);
  nghttp2_mem_free(mem,entry);
  return 0;
}

Assistant:

static int free_streams(void *entry, void *ptr) {
  nghttp2_session *session;
  nghttp2_stream *stream;
  nghttp2_outbound_item *item;
  nghttp2_mem *mem;

  session = (nghttp2_session *)ptr;
  mem = &session->mem;
  stream = (nghttp2_stream *)entry;
  item = stream->item;

  if (item && !item->queued && item != session->aob.item) {
    nghttp2_outbound_item_free(item, mem);
    nghttp2_mem_free(mem, item);
  }

  nghttp2_stream_free(stream);
  nghttp2_mem_free(mem, stream);

  return 0;
}